

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlStatus htmlNodeStatus(htmlNodePtr node,int legacy)

{
  int iVar1;
  htmlStatus hVar2;
  htmlElemDesc *phVar3;
  htmlElemDesc *elt;
  
  if (node == (htmlNodePtr)0x0) {
    hVar2 = HTML_INVALID;
  }
  else {
    if (node->type == XML_ATTRIBUTE_NODE) {
      phVar3 = htmlTagLookup(node->parent->name);
      hVar2 = htmlAttrAllowed(phVar3,node->name,legacy);
      return hVar2;
    }
    hVar2 = HTML_NA;
    if (node->type == XML_ELEMENT_NODE) {
      phVar3 = htmlTagLookup(node->parent->name);
      if (legacy == 0) {
        elt = htmlTagLookup(node->name);
        hVar2 = htmlElementStatusHere(phVar3,elt);
        return hVar2;
      }
      iVar1 = htmlElementAllowedHere(phVar3,node->name);
      hVar2 = (uint)(iVar1 != 0) * 3 + HTML_INVALID;
    }
  }
  return hVar2;
}

Assistant:

htmlStatus
htmlNodeStatus(const htmlNodePtr node, int legacy) {
  if ( ! node )
    return HTML_INVALID ;

  switch ( node->type ) {
    case XML_ELEMENT_NODE:
      return legacy
	? ( htmlElementAllowedHere (
		htmlTagLookup(node->parent->name) , node->name
		) ? HTML_VALID : HTML_INVALID )
	: htmlElementStatusHere(
		htmlTagLookup(node->parent->name) ,
		htmlTagLookup(node->name) )
	;
    case XML_ATTRIBUTE_NODE:
      return htmlAttrAllowed(
	htmlTagLookup(node->parent->name) , node->name, legacy) ;
    default: return HTML_NA ;
  }
}